

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

void QCoreApplication::removePostedEvents(QObject *receiver,int eventType)

{
  QPostEventList *this;
  QAtomicInt *pQVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  QPostEvent *pQVar5;
  QObject *pQVar6;
  long lVar7;
  QEvent *pQVar8;
  QEvent *pQVar9;
  undefined8 uVar10;
  pointer pQVar11;
  pointer pQVar12;
  iterator iVar13;
  iterator aend;
  long lVar14;
  qsizetype i;
  long lVar15;
  QEvent **t;
  long in_FS_OFFSET;
  long local_870;
  undefined1 local_868 [24];
  QVarLengthArray<QEvent_*,_256LL> local_850;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_868._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_868._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_868._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCoreApplicationPrivate::lockThreadPostEventList((QPostEventListLocker *)local_868,receiver);
  uVar10 = local_868._0_8_;
  if ((receiver == (QObject *)0x0) ||
     ((((receiver->d_ptr).d)->postedEvents).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int>._M_i != 0)) {
    memset(&local_850.super_QVLAStorage<8UL,_8UL,_256LL>,0xaa,0x800);
    local_850.super_QVLABase<QEvent_*>.super_QVLABaseBase.a = 0x100;
    local_850.super_QVLABase<QEvent_*>.super_QVLABaseBase.s = 0;
    this = (QPostEventList *)(uVar10 + 0x18);
    lVar4 = (((QPostEventList *)(uVar10 + 0x18))->super_QList<QPostEvent>).d.size;
    lVar14 = 8;
    local_870 = 0;
    local_850.super_QVLABase<QEvent_*>.super_QVLABaseBase.ptr =
         &local_850.super_QVLAStorage<8UL,_8UL,_256LL>;
    for (lVar15 = 0; lVar4 != lVar15; lVar15 = lVar15 + 1) {
      pQVar5 = (((QPostEventList *)(uVar10 + 0x18))->super_QList<QPostEvent>).d.ptr;
      pQVar6 = *(QObject **)((long)pQVar5 + lVar14 + -8);
      if ((((receiver == (QObject *)0x0) || (pQVar6 == receiver)) &&
          (lVar7 = *(long *)((long)&pQVar5->receiver + lVar14), lVar7 != 0)) &&
         ((eventType == 0 || ((uint)*(ushort *)(lVar7 + 8) == eventType)))) {
        LOCK();
        pQVar1 = &((pQVar6->d_ptr).d)->postedEvents;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        t = (QEvent **)((long)&pQVar5->receiver + lVar14);
        (*t)->m_posted = false;
        QVarLengthArray<QEvent_*,_256LL>::append(&local_850,t);
        *t = (QEvent *)0x0;
      }
      else if (((QPostEventList *)(uVar10 + 0x18))->recursion == 0) {
        if (lVar15 != local_870) {
          pQVar11 = QList<QPostEvent>::data((QList<QPostEvent> *)this);
          pQVar12 = QList<QPostEvent>::data((QList<QPostEvent> *)this);
          iVar3 = *(int *)((long)&pQVar11->event + lVar14);
          puVar2 = (undefined8 *)((long)pQVar11 + lVar14 + -8);
          pQVar6 = (QObject *)*puVar2;
          pQVar8 = (QEvent *)puVar2[1];
          *(int *)((long)&pQVar11->event + lVar14) = pQVar12[local_870].priority;
          pQVar9 = pQVar12[local_870].event;
          puVar2 = (undefined8 *)((long)pQVar11 + lVar14 + -8);
          *puVar2 = pQVar12[local_870].receiver;
          puVar2[1] = pQVar9;
          pQVar12[local_870].receiver = pQVar6;
          pQVar12[local_870].event = pQVar8;
          pQVar12[local_870].priority = iVar3;
        }
        local_870 = local_870 + 1;
      }
      lVar14 = lVar14 + 0x18;
    }
    if (((QPostEventList *)(uVar10 + 0x18))->recursion == 0) {
      iVar13 = QList<QPostEvent>::begin((QList<QPostEvent> *)this);
      aend = QList<QPostEvent>::end((QList<QPostEvent> *)this);
      QList<QPostEvent>::erase
                ((QList<QPostEvent> *)this,iVar13.i + local_870,(const_iterator)aend.i);
    }
    std::unique_lock<QMutex>::unlock((unique_lock<QMutex> *)(local_868 + 8));
    qDeleteAll<QVarLengthArray<QEvent*,256ll>>(&local_850);
    QVarLengthArray<QEvent_*,_256LL>::~QVarLengthArray(&local_850);
  }
  std::unique_lock<QMutex>::~unique_lock((unique_lock<QMutex> *)(local_868 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCoreApplication::removePostedEvents(QObject *receiver, int eventType)
{
    auto locker = QCoreApplicationPrivate::lockThreadPostEventList(receiver);
    QThreadData *data = locker.threadData;

    // the QObject destructor calls this function directly.  this can
    // happen while the event loop is in the middle of posting events,
    // and when we get here, we may not have any more posted events
    // for this object.
    if (receiver && !receiver->d_func()->postedEvents.loadAcquire())
        return;

    //we will collect all the posted events for the QObject
    //and we'll delete after the mutex was unlocked
    QVarLengthArray<QEvent*> events;
    qsizetype n = data->postEventList.size();
    qsizetype j = 0;

    for (qsizetype i = 0; i < n; ++i) {
        const QPostEvent &pe = data->postEventList.at(i);

        if ((!receiver || pe.receiver == receiver)
            && (pe.event && (eventType == 0 || pe.event->type() == eventType))) {
            pe.receiver->d_func()->postedEvents.fetchAndSubAcquire(1);
            pe.event->m_posted = false;
            events.append(pe.event);
            const_cast<QPostEvent &>(pe).event = nullptr;
        } else if (!data->postEventList.recursion) {
            if (i != j)
                qSwap(data->postEventList[i], data->postEventList[j]);
            ++j;
        }
    }

#ifdef QT_DEBUG
    if (receiver && eventType == 0) {
        Q_ASSERT(!receiver->d_func()->postedEvents);
    }
#endif

    if (!data->postEventList.recursion) {
        // truncate list
        data->postEventList.erase(data->postEventList.begin() + j, data->postEventList.end());
    }

    locker.unlock();
    qDeleteAll(events);
}